

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O0

void __thiscall EfcFlash::writeOptions(EfcFlash *this)

{
  uint8_t uVar1;
  bool bVar2;
  const_reference cVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  vector<bool,_std::allocator<bool>_> *pvVar7;
  size_type sVar8;
  bool *pbVar9;
  reference rVar10;
  reference local_88;
  uint local_78;
  uint32_t region;
  vector<bool,_std::allocator<bool>_> local_68;
  undefined1 local_40 [8];
  vector<bool,_std::allocator<bool>_> current;
  uint32_t page;
  EfcFlash *this_local;
  
  uVar4 = (*(this->super_Flash)._vptr_Flash[0x16])();
  if (((uVar4 & 1) != 0) &&
     (bVar2 = FlashOption<bool>::isDirty(&(this->super_Flash)._bootFlash), bVar2)) {
    pbVar9 = FlashOption<bool>::get(&(this->super_Flash)._bootFlash);
    bVar2 = *pbVar9;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0x14])();
    if ((bVar2 & 1U) != ((byte)iVar5 & 1)) {
      waitFSR(this,1);
      pbVar9 = FlashOption<bool>::get(&(this->super_Flash)._bootFlash);
      uVar1 = '\r';
      if ((*pbVar9 & 1U) != 0) {
        uVar1 = '\v';
      }
      writeFCR0(this,uVar1,2);
    }
  }
  uVar4 = (*(this->super_Flash)._vptr_Flash[0x13])();
  if (((uVar4 & 1) != 0) && (bVar2 = FlashOption<bool>::isDirty(&(this->super_Flash)._bor), bVar2))
  {
    pbVar9 = FlashOption<bool>::get(&(this->super_Flash)._bor);
    bVar2 = *pbVar9;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0x11])();
    if ((bVar2 & 1U) != ((byte)iVar5 & 1)) {
      waitFSR(this,1);
      pbVar9 = FlashOption<bool>::get(&(this->super_Flash)._bor);
      uVar1 = '\r';
      if ((*pbVar9 & 1U) != 0) {
        uVar1 = '\v';
      }
      writeFCR0(this,uVar1,1);
    }
  }
  uVar4 = (*(this->super_Flash)._vptr_Flash[0x10])();
  if (((uVar4 & 1) != 0) && (bVar2 = FlashOption<bool>::isDirty(&(this->super_Flash)._bod), bVar2))
  {
    pbVar9 = FlashOption<bool>::get(&(this->super_Flash)._bod);
    bVar2 = *pbVar9;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0xe])();
    if ((bVar2 & 1U) != ((byte)iVar5 & 1)) {
      waitFSR(this,1);
      pbVar9 = FlashOption<bool>::get(&(this->super_Flash)._bod);
      uVar1 = '\r';
      if ((*pbVar9 & 1U) != 0) {
        uVar1 = '\v';
      }
      writeFCR0(this,uVar1,0);
    }
  }
  bVar2 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::isDirty
                    (&(this->super_Flash)._regions);
  if (bVar2) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_40);
    (*(this->super_Flash)._vptr_Flash[10])(&local_68);
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)local_40,&local_68);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_68);
    local_78 = 0;
    while( true ) {
      uVar6 = (ulong)local_78;
      pvVar7 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::get
                         (&(this->super_Flash)._regions);
      sVar8 = std::vector<bool,_std::allocator<bool>_>::size(pvVar7);
      if (sVar8 <= uVar6) break;
      pvVar7 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::get
                         (&(this->super_Flash)._regions);
      cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar7,(ulong)local_78);
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_40,(ulong)local_78);
      local_88 = rVar10;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_88);
      if (cVar3 != bVar2) {
        if (((this->super_Flash)._planes == 2) &&
           ((this->super_Flash)._lockRegions >> 1 <= local_78)) {
          uVar4 = (this->super_Flash)._lockRegions;
          current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage._4_4_ = ((local_78 - (uVar4 >> 1)) * (this->super_Flash)._pages) / uVar4
          ;
          waitFSR(this,1);
          pvVar7 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::get
                             (&(this->super_Flash)._regions);
          cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar7,(ulong)local_78);
          writeFCR1(this,(~cVar3 & 1U) * '\x02' + '\x02',
                    current.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage._4_4_);
        }
        else {
          current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage._4_4_ =
               (local_78 * (this->super_Flash)._pages) / (this->super_Flash)._lockRegions;
          waitFSR(this,1);
          pvVar7 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::get
                             (&(this->super_Flash)._regions);
          cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar7,(ulong)local_78);
          writeFCR0(this,(~cVar3 & 1U) * '\x02' + '\x02',
                    current.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage._4_4_);
        }
      }
      local_78 = local_78 + 1;
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_40);
  }
  bVar2 = FlashOption<bool>::isDirty(&(this->super_Flash)._security);
  if (bVar2) {
    pbVar9 = FlashOption<bool>::get(&(this->super_Flash)._security);
    if ((*pbVar9 & 1U) == 1) {
      pbVar9 = FlashOption<bool>::get(&(this->super_Flash)._security);
      bVar2 = *pbVar9;
      iVar5 = (*(this->super_Flash)._vptr_Flash[0xc])();
      if ((bVar2 & 1U) != ((byte)iVar5 & 1)) {
        waitFSR(this,1);
        writeFCR0(this,'\x0f',0);
      }
    }
  }
  return;
}

Assistant:

void
EfcFlash::writeOptions()
{
    if (canBootFlash() && _bootFlash.isDirty() && _bootFlash.get() != getBootFlash())
    {
        waitFSR();
        writeFCR0(_bootFlash.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 2);
    }
    if (canBor() && _bor.isDirty() && _bor.get() != getBor())
    {
        waitFSR();
        writeFCR0(_bor.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 1);
    }
    if (canBod() && _bod.isDirty() && _bod.get() != getBod())
    {
        waitFSR();
        writeFCR0(_bod.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 0);
    }
    if (_regions.isDirty())
    {
        uint32_t page;
        std::vector<bool> current;

        current = getLockRegions();

        for (uint32_t region = 0; region < _regions.get().size(); region++)
        {
            if (_regions.get()[region] != current[region])
            {
                if (_planes == 2 && region >= _lockRegions / 2)
                {
                    page = (region - _lockRegions / 2) * _pages / _lockRegions;
                    waitFSR();
                    writeFCR1(_regions.get()[region] ? EFC_FCMD_SLB : EFC_FCMD_CLB, page);
                }
                else
                {
                    page = region * _pages / _lockRegions;
                    waitFSR();
                    writeFCR0(_regions.get()[region] ? EFC_FCMD_SLB : EFC_FCMD_CLB, page);
                }
            }
        }
    }
    if (_security.isDirty() && _security.get() == true && _security.get() != getSecurity())
    {
        waitFSR();
        writeFCR0(EFC_FCMD_SSB, 0);
    }
}